

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void hta::
     throw_exception<hta::Exception,char_const*,std::filesystem::__cxx11::path,char_const*,char_const*>
               (char *args,path *args_1,char *args_2,char *args_3)

{
  runtime_error *this;
  stringstream msg;
  make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_const_char_*>
  amStack_1f8 [32];
  path local_1d8;
  stringstream local_1b0 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::filesystem::__cxx11::path::path(&local_1d8,args_1);
  detail::make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_const_char_*>::
  operator()(amStack_1f8,(stringstream *)local_1b0,args,&local_1d8,args_2,args_3);
  std::filesystem::__cxx11::path::~path(&local_1d8);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,(string *)amStack_1f8);
  *(undefined ***)this = &PTR__runtime_error_00120aa0;
  __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}